

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O3

void __thiscall
Js::ParseableFunctionInfo::CopyNestedArray(ParseableFunctionInfo *this,ParseableFunctionInfo *other)

{
  NestedArray *pNVar1;
  NestedArray NVar2;
  code *pcVar3;
  bool bVar4;
  Type TVar5;
  undefined4 *puVar6;
  NestedArray *addr;
  ulong uVar7;
  
  pNVar1 = (this->nestedArray).ptr;
  addr = (other->nestedArray).ptr;
  if (pNVar1 == (NestedArray *)0x0) {
    if (addr != (NestedArray *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar6 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                  ,0x629,"(otherNestedArray == nullptr)",
                                  "otherNestedArray == nullptr");
      if (!bVar4) goto LAB_0075e469;
      *puVar6 = 0;
    }
  }
  else {
    TVar5 = addr->nestedCount;
    if (TVar5 != pNVar1->nestedCount) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar6 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                  ,0x62c,
                                  "(otherNestedArray->nestedCount == thisNestedArray->nestedCount)",
                                  "otherNestedArray->nestedCount == thisNestedArray->nestedCount");
      if (!bVar4) {
LAB_0075e469:
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar6 = 0;
      TVar5 = pNVar1->nestedCount;
    }
    if (TVar5 != 0) {
      uVar7 = 0;
      do {
        addr = addr + 1;
        NVar2 = pNVar1[uVar7 + 1];
        Memory::Recycler::WBSetBit((char *)addr);
        *addr = NVar2;
        Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
        uVar7 = uVar7 + 1;
      } while (uVar7 < pNVar1->nestedCount);
    }
  }
  return;
}

Assistant:

void ParseableFunctionInfo::CopyNestedArray(ParseableFunctionInfo * other)
    {
        NestedArray * thisNestedArray = this->GetNestedArray();
        NestedArray * otherNestedArray = other->GetNestedArray();
        if (thisNestedArray == nullptr)
        {
            Assert(otherNestedArray == nullptr);
            return;
        }
        Assert(otherNestedArray->nestedCount == thisNestedArray->nestedCount);

        for (uint i = 0; i < thisNestedArray->nestedCount; i++)
        {
            otherNestedArray->functionInfoArray[i] = thisNestedArray->functionInfoArray[i];
        }
    }